

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O1

void __thiscall BVStatic<4096UL>::SetRange(BVStatic<4096UL> *this,BVIndex index,uint length)

{
  uint uVar1;
  sbyte sVar2;
  ulong uVar3;
  Type *__s;
  uint uVar4;
  uint uVar5;
  
  AssertRange(this,index);
  AssertRange(this,(index + length) - 1);
  AssertRange(this,index);
  __s = this->data + (index >> 6);
  sVar2 = (sbyte)(index & 0x3f);
  if ((index & 0x3f) + length < 0x41) {
    uVar3 = (0xffffffffffffffffU >> (-(char)length & 0x3fU)) << sVar2;
  }
  else {
    __s->word = __s->word | -1L << sVar2;
    uVar5 = index | 0xffffffc0;
    uVar4 = uVar5 + length;
    __s = __s + 1;
    if (0x3f < uVar4) {
      uVar1 = (uVar5 + length) - 0x40 >> 6;
      memset(__s,0xff,(ulong)(uVar1 * 8 + 8));
      uVar4 = uVar5 + length & 0x3f;
      __s = (Type *)((long)&this->data[(ulong)(index >> 6) + 2].word + (ulong)(uVar1 << 3));
    }
    if (uVar4 == 0) {
      return;
    }
    uVar3 = 0xffffffffffffffff >> (-(char)uVar4 & 0x3fU);
  }
  __s->word = __s->word | uVar3;
  return;
}

Assistant:

void SetRange(const BVIndex index, uint length)
    {
        AssertRange(index);
        AssertRange(index + length - 1);

        BVUnit * bvUnit = BitsFromIndex(index);
        uint offset = BVUnit::Offset(index);

        if (offset + length <= BVUnit::BitsPerWord)
        {
            // Bit range is in a single word
            return bvUnit->SetRange(offset, length);
        }

        // Bit range spans words.
        // Set the first word, from start offset to end of word
        bvUnit->SetRange(offset, (BVUnit::BitsPerWord - offset));

        bvUnit++;
        length -= (BVUnit::BitsPerWord - offset);

        // Set entire words until we are at the last word
        while (length >= BVUnit::BitsPerWord)
        {
            bvUnit->SetAll();

            bvUnit++;
            length -= BVUnit::BitsPerWord;
        }

        // Set last word (unless we already ended on a word boundary)
        if (length > 0)
        {
            bvUnit->SetRange(0, length);
        }
    }